

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O3

int __thiscall
icu_63::RelativeDateFormat::clone
          (RelativeDateFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RelativeDateFormat *this_00;
  
  this_00 = (RelativeDateFormat *)UMemory::operator_new((UMemory *)0x2f8,(size_t)__fn);
  if (this_00 != (RelativeDateFormat *)0x0) {
    RelativeDateFormat(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Format* RelativeDateFormat::clone(void) const {
    return new RelativeDateFormat(*this);
}